

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

int message_get_body_amqp_sequence_count(MESSAGE_HANDLE message,size_t *count)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (message == (MESSAGE_HANDLE)0x0 || count == (size_t *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x56d;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                ,"message_get_body_amqp_sequence_count",0x56c,1,
                "Bad arguments: message = %p, count = %p",message,count);
    }
  }
  else if (((message->body_amqp_value == (AMQP_VALUE)0x0) && (message->body_amqp_data_count == 0))
          && (message->body_amqp_sequence_count != 0)) {
    *count = message->body_amqp_sequence_count;
    iVar2 = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x576;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                ,"message_get_body_amqp_sequence_count",0x575,1,"Body is not of type SEQUENCE");
    }
  }
  return iVar2;
}

Assistant:

int message_get_body_amqp_sequence_count(MESSAGE_HANDLE message, size_t* count)
{
    int result;

    if ((message == NULL) ||
        (count == NULL))
    {
        /* Codes_SRS_MESSAGE_01_123: [ If `message` or `count` is NULL, `message_get_body_amqp_sequence_count` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, count = %p",
            message, count);
        result = MU_FAILURE;
    }
    else
    {
        MESSAGE_BODY_TYPE body_type = internal_get_body_type(message);
        if (body_type != MESSAGE_BODY_TYPE_SEQUENCE)
        {
            /* Codes_SRS_MESSAGE_01_124: [ If the body for `message` is not of type `MESSAGE_BODY_TYPE_SEQUENCE`, `message_get_body_amqp_sequence_count` shall fail and return a non-zero value. ]*/
            LogError("Body is not of type SEQUENCE");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_121: [ `message_get_body_amqp_sequence_count` shall fill in `count` the number of AMQP sequences that are stored by the message identified by `message`. ]*/
            *count = message->body_amqp_sequence_count;

            /* Codes_SRS_MESSAGE_01_122: [ On success, `message_get_body_amqp_sequence_count` shall return 0. ]*/
            result = 0;
        }
    }

    return result;
}